

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

Float __thiscall pbrt::PaddedSobolSampler::Get1D(PaddedSobolSampler *this)

{
  int textureIndex;
  uint32_t a;
  uint64_t uVar1;
  CranleyPattersonRotator randomizer;
  float fVar2;
  Float FVar3;
  
  uVar1 = MixBits((long)*Options ^
                  (long)this->dimension << 0x10 ^
                  (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.y << 0x20 ^
                  (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.x << 0x30);
  a = PermutationElement(this->sampleIndex,this->samplesPerPixel,(uint32_t)uVar1);
  textureIndex = this->dimension;
  this->dimension = textureIndex + 1;
  if (this->randomizeStrategy == CranleyPatterson) {
    fVar2 = BlueNoise(textureIndex,(Point2i)(this->pixel).super_Tuple2<pbrt::Point2,_int>);
    randomizer.delta = vcvttss2usi_avx512f(ZEXT416((uint)(fVar2 * 4.2949673e+09)));
    fVar2 = SobolSampleFloat<pbrt::CranleyPattersonRotator>((long)(int)a,0,randomizer);
    return fVar2;
  }
  FVar3 = SampleDimension(this,0,a,(uint32_t)(uVar1 >> 0x20));
  return FVar3;
}

Assistant:

PBRT_CPU_GPU
    Float Get1D() {
        // Get permuted index for current pixel sample
        uint64_t hash = MixBits(((uint64_t)pixel.x << 48) ^ ((uint64_t)pixel.y << 32) ^
                                ((uint64_t)dimension << 16) ^ GetOptions().seed);
        int index = PermutationElement(sampleIndex, samplesPerPixel, hash);

        int dim = dimension++;
        // Return randomized 1D van der Corput sample for dimension _dim_
        if (randomizeStrategy == RandomizeStrategy::CranleyPatterson)
            // Return 1D sample randomized with Cranley-Patterson rotation
            return SobolSample(index, 0, CranleyPattersonRotator(BlueNoise(dim, pixel)));

        else
            return SampleDimension(0, index, hash >> 32);
    }